

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::~ClipboardImpl(ClipboardImpl *this)

{
  long *in_RDI;
  Display *unaff_retaddr;
  deque<_XEvent,_std::allocator<_XEvent>_> *in_stack_00000040;
  
  if (*in_RDI != 0) {
    XDestroyWindow(in_RDI[1],*in_RDI);
    XFlush(in_RDI[1]);
  }
  CloseDisplay(unaff_retaddr);
  std::deque<_XEvent,_std::allocator<_XEvent>_>::~deque(in_stack_00000040);
  String::~String((String *)0x244aaa);
  return;
}

Assistant:

ClipboardImpl::~ClipboardImpl()
{
    // Destroy the window
    if (m_window)
    {
        XDestroyWindow(m_display, m_window);
        XFlush(m_display);
    }

    // Close the connection with the X server
    CloseDisplay(m_display);
}